

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O3

void __thiscall
Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>::Stack
          (Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> *this,
          size_t initialCapacity)

{
  MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_> *pMVar1;
  size_t sVar2;
  ulong uVar3;
  
  this->_capacity = initialCapacity;
  if (initialCapacity == 0) {
    this->_stack = (MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)0x0;
    sVar2 = 0;
    pMVar1 = (MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)0x0;
  }
  else {
    uVar3 = initialCapacity * 0x1c + 0xf & 0xfffffffffffffff0;
    if (uVar3 == 0) {
      pMVar1 = (MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)
               FixedSizeAllocator<8UL>::alloc
                         ((FixedSizeAllocator<8UL> *)GLOBAL_SMALL_OBJECT_ALLOCATOR);
    }
    else if (uVar3 < 0x11) {
      pMVar1 = (MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)
               FixedSizeAllocator<16UL>::alloc
                         ((FixedSizeAllocator<16UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
    }
    else if (uVar3 < 0x19) {
      pMVar1 = (MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)
               FixedSizeAllocator<24UL>::alloc
                         ((FixedSizeAllocator<24UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30));
    }
    else if (uVar3 < 0x21) {
      pMVar1 = (MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)
               FixedSizeAllocator<32UL>::alloc
                         ((FixedSizeAllocator<32UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
    }
    else if (uVar3 < 0x31) {
      pMVar1 = (MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)
               FixedSizeAllocator<48UL>::alloc
                         ((FixedSizeAllocator<48UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
    }
    else if (uVar3 < 0x41) {
      pMVar1 = (MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)
               FixedSizeAllocator<64UL>::alloc
                         ((FixedSizeAllocator<64UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
    }
    else {
      pMVar1 = (MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)
               ::operator_new(uVar3,0x10);
    }
    this->_stack = pMVar1;
    sVar2 = this->_capacity;
  }
  this->_cursor = pMVar1;
  this->_end = pMVar1 + sVar2;
  return;
}

Assistant:

inline
  explicit Stack (size_t initialCapacity=0)
    : _capacity(initialCapacity)
  {
    if(_capacity) {
      void* mem = ALLOC_KNOWN(_capacity*sizeof(C),className());
      _stack = static_cast<C*>(mem);
    }
    else {
      _stack = nullptr;
    }
    _cursor = _stack;
    _end = _stack+_capacity;
  }